

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddl.cpp
# Opt level: O0

void __thiscall ddl::createType(ddl *this,string *typeName,int numFields,string *fields)

{
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  reference this_00;
  set<type,_std::less<type>,_std::allocator<type>_> *this_01;
  SystemCatalog *__n;
  pair<std::_Rb_tree_const_iterator<type>,_bool> pVar4;
  string local_150 [32];
  file local_130;
  _Base_ptr local_f8;
  undefined1 local_f0;
  string local_e8 [32];
  reference local_c8;
  type *_i;
  iterator __end1;
  iterator __begin1;
  set<type,_std::less<type>,_std::allocator<type>_> *__range1;
  int pos;
  int local_94;
  undefined1 local_90 [4];
  int j;
  type type;
  _Self local_30;
  iterator i;
  string *fields_local;
  int numFields_local;
  string *typeName_local;
  ddl *this_local;
  
  i._M_node = (_Base_ptr)fields;
  local_30._M_node = (_Base_ptr)SystemCatalog::getType(this->systemCatalog,typeName);
  type.dir = (directory *)
             std::set<type,_std::less<type>,_std::allocator<type>_>::end
                       (&this->systemCatalog->types);
  bVar1 = std::operator!=(&local_30,(_Self *)&type.dir);
  if (!bVar1) {
    ::type::type((type *)local_90,typeName,(uint8_t)numFields);
    for (local_94 = 0; local_94 < numFields; local_94 = local_94 + 1) {
      p_Var3 = i._M_node + local_94;
      this_00 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&type.primaryKey,(long)local_94);
      std::__cxx11::string::operator=((string *)this_00,(string *)p_Var3);
    }
    __range1._0_4_ = 4;
    this_01 = &this->systemCatalog->types;
    __end1 = std::set<type,_std::less<type>,_std::allocator<type>_>::begin(this_01);
    _i = (type *)std::set<type,_std::less<type>,_std::allocator<type>_>::end(this_01);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&_i), bVar1) {
      local_c8 = std::_Rb_tree_const_iterator<type>::operator*(&__end1);
      iVar2 = calcTypeSize((uint)local_c8->numFields);
      __range1._0_4_ = iVar2 + (uint)__range1;
      std::_Rb_tree_const_iterator<type>::operator++(&__end1);
    }
    __n = this->systemCatalog;
    __n->numTypes = __n->numTypes + 1;
    SystemCatalog::writeNumTypes(this->systemCatalog);
    std::__cxx11::string::string(local_e8,(string *)typeName);
    type.fieldsName.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)createIndex((string *)local_e8);
    std::__cxx11::string::~string(local_e8);
    ::type::write((type *)local_90,(int)this->systemCatalog + 0x38,(void *)(ulong)(uint)__range1,
                  (size_t)__n);
    pVar4 = std::set<type,_std::less<type>,_std::allocator<type>_>::insert
                      (&this->systemCatalog->types,(value_type *)local_90);
    local_f8 = (_Base_ptr)pVar4.first._M_node;
    local_f0 = pVar4.second;
    std::__cxx11::string::string(local_150,(string *)typeName);
    createAndLinkFiles(&local_130,(string *)local_150,1,0,0);
    file::~file(&local_130);
    std::__cxx11::string::~string(local_150);
    ::type::~type((type *)local_90);
  }
  return;
}

Assistant:

void ddl::createType(std::string typeName, int numFields, std::string *fields) {
    auto i = systemCatalog->getType(typeName);

    if(i != systemCatalog->types.end()) {
        return;
    }

    type type(typeName, (int8_t ) numFields);

    for (int j = 0; j < numFields; ++j) {
        type.fieldsName[j] = fields[j];
    }

    int pos = NUM_TYPES;

    //Get the end of file;
    for(auto & _i : systemCatalog->types) {
        pos += calcTypeSize(_i.numFields);

    }

    systemCatalog->numTypes++;

    systemCatalog->writeNumTypes();

    type.dir = createIndex(typeName);

    type.write(systemCatalog->catalogFile, pos);

    systemCatalog->types.insert(type);

    createAndLinkFiles(typeName, 1, 0, 0);
}